

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O1

int set_strap_from_file(char *path)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char tmp [22];
  char acStack_28 [32];
  
  __stream = fopen(path,"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = 1;
  }
  else {
    sVar2 = fread(acStack_28,1,0x15,__stream);
    acStack_28[sVar2] = '\0';
    iVar1 = set_strap_from_string(acStack_28);
  }
  return iVar1;
}

Assistant:

int set_strap_from_file(const char *path)
{
	FILE *strapfile = NULL;
	char tmp[22];

	strapfile = fopen(path, "r");
	if (strapfile) {
		size_t size = fread(tmp, 1, 21, strapfile);
		tmp[size] = 0;
		return set_strap_from_string(tmp);
	}

	return 1;
}